

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_process_siz(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_sizcomp_t *pjVar1;
  uint_fast32_t uVar2;
  uint_fast32_t uVar3;
  uint_fast32_t uVar4;
  uint_fast32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  ulong uVar18;
  jpc_dec_cp_t *pjVar19;
  jpc_dec_cmpt_t *pjVar20;
  ulong uVar21;
  ulong uVar22;
  jpc_dec_tile_t *pjVar23;
  jpc_dec_tcomp_t *pjVar24;
  uint_fast32_t *puVar25;
  jpc_dec_tile_t *pjVar26;
  ulong uVar27;
  char *fmt;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  
  uVar21 = (ms->parms).sot.len;
  uVar22 = (ms->parms).siz.height;
  if ((uVar21 == 0) ||
     (auVar10._8_8_ = 0, auVar10._0_8_ = uVar21, auVar13._8_8_ = 0, auVar13._0_8_ = uVar22,
     uVar18 = SUB168(auVar10 * auVar13,0), SUB168(auVar10 * auVar13,8) == 0)) {
    uVar18 = uVar22 * uVar21;
    bVar31 = true;
  }
  else {
    bVar31 = false;
  }
  if ((bVar31) && ((uVar28 = dec->max_samples, uVar28 == 0 || (uVar18 <= uVar28)))) {
    uVar18 = (ms->parms).siz.tilewidth;
    uVar29 = (ms->parms).siz.tileheight;
    if ((uVar18 == 0) ||
       (auVar11._8_8_ = 0, auVar11._0_8_ = uVar18, auVar14._8_8_ = 0, auVar14._0_8_ = uVar29,
       uVar27 = SUB168(auVar11 * auVar14,8), uVar27 == 0)) {
      uVar27 = uVar29 * uVar18;
      bVar31 = false;
    }
    else {
      bVar31 = true;
    }
    if ((!bVar31) && (uVar28 == 0 || uVar27 <= uVar28)) {
      dec->xstart = (ms->parms).siz.xoff;
      dec->ystart = (ms->parms).siz.yoff;
      dec->xend = uVar21;
      dec->yend = uVar22;
      dec->tilewidth = uVar18;
      dec->tileheight = uVar29;
      dec->tilexoff = (ms->parms).siz.tilexoff;
      dec->tileyoff = (ms->parms).siz.tileyoff;
      iVar16 = (int)(ms->parms).siz.numcomps;
      dec->numcomps = iVar16;
      pjVar19 = jpc_dec_cp_create((long)iVar16);
      dec->cp = pjVar19;
      if (pjVar19 == (jpc_dec_cp_t *)0x0) {
        return -1;
      }
      pjVar20 = (jpc_dec_cmpt_t *)jas_alloc2((long)dec->numcomps,0x40);
      dec->cmpts = pjVar20;
      if (pjVar20 == (jpc_dec_cmpt_t *)0x0) {
        return -1;
      }
      uVar21 = (ulong)dec->numcomps;
      if ((long)uVar21 < 1) {
        uVar22 = 0;
      }
      else {
        pjVar1 = (ms->parms).siz.comps;
        uVar2 = dec->xend;
        uVar3 = dec->xstart;
        uVar4 = dec->ystart;
        uVar5 = dec->yend;
        puVar25 = &pjVar20->hsubstep;
        uVar18 = 0;
        uVar22 = 0;
        do {
          puVar25[-2] = (ulong)pjVar1[uVar18].prec;
          *(bool *)(puVar25 + -1) = pjVar1[uVar18].sgnd != '\0';
          uVar28 = (ulong)pjVar1[uVar18].hsamp;
          ((jpc_dec_cmpt_t *)(puVar25 + -6))->hstep = uVar28;
          uVar29 = (ulong)pjVar1[uVar18].vsamp;
          puVar25[-5] = uVar29;
          uVar29 = ((uVar29 + uVar5) - 1) / uVar29 - ((uVar29 + uVar4) - 1) / uVar29;
          uVar28 = ((uVar2 + uVar28) - 1) / uVar28 - ((uVar3 + uVar28) - 1) / uVar28;
          puVar25[-4] = uVar28;
          puVar25[-3] = uVar29;
          *puVar25 = 0;
          puVar25[1] = 0;
          if ((uVar28 == 0) ||
             (auVar12._8_8_ = 0, auVar12._0_8_ = uVar28, auVar15._8_8_ = 0, auVar15._0_8_ = uVar29,
             SUB168(auVar12 * auVar15,8) == 0)) {
            ms = (jpc_ms_t *)(uVar29 * uVar28);
            bVar31 = true;
          }
          else {
            bVar31 = false;
          }
          if ((!bVar31) ||
             (bVar31 = CARRY8(uVar22,(ulong)ms), uVar22 = (long)&ms->id + uVar22, bVar31)) {
            jas_eprintf("image too large\n");
            return -1;
          }
          uVar18 = uVar18 + 1;
          puVar25 = puVar25 + 8;
        } while (uVar21 != uVar18);
      }
      uVar18 = dec->max_samples;
      if ((uVar18 != 0) && (uVar18 < uVar22)) {
        jas_eprintf("maximum number of samples exceeded (%zu > %zu)\n",uVar22,uVar18);
        return -1;
      }
      dec->image = (jas_image_t *)0x0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dec->tilewidth;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = ~dec->tilexoff + dec->xend + dec->tilewidth;
      uVar22 = SUB168(auVar8 / auVar6,0);
      iVar16 = SUB164(auVar8 / auVar6,0);
      dec->numhtiles = iVar16;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dec->tileheight;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = ~dec->tileyoff + dec->yend + dec->tileheight;
      uVar28 = SUB168(auVar9 / auVar7,0);
      iVar17 = SUB164(auVar9 / auVar7,0);
      dec->numvtiles = iVar17;
      if (iVar16 < 0) {
        __assert_fail("dec->numhtiles >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                      ,0x534,"int jpc_dec_process_siz(jpc_dec_t *, jpc_ms_t *)");
      }
      if (iVar17 < 0) {
        __assert_fail("dec->numvtiles >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                      ,0x535,"int jpc_dec_process_siz(jpc_dec_t *, jpc_ms_t *)");
      }
      uVar29 = (uVar28 & 0x7fffffff) * (uVar22 & 0x7fffffff);
      if (0x7fffffff < uVar29) {
        return -1;
      }
      if ((uVar18 != 0) && (uVar18 >> 8 <= uVar29 && uVar29 - (uVar18 >> 8) != 0)) {
        return -1;
      }
      if ((uVar18 != 0) && (uVar21 = uVar18 / uVar21 >> 4, uVar21 <= uVar29 && uVar29 - uVar21 != 0)
         ) {
        return -1;
      }
      dec->numtiles = (int)uVar29;
      iVar16 = jas_getdbglevel();
      if (9 < iVar16) {
        jas_eprintf("numtiles = %d; numhtiles = %d; numvtiles = %d;\n",uVar29 & 0xffffffff,
                    uVar22 & 0xffffffff,uVar28 & 0xffffffff);
      }
      pjVar23 = (jpc_dec_tile_t *)jas_alloc2((long)dec->numtiles,0x68);
      dec->tiles = pjVar23;
      if (pjVar23 == (jpc_dec_tile_t *)0x0) {
        return -1;
      }
      iVar16 = dec->numtiles;
      pjVar26 = pjVar23;
      if (0 < iVar16) {
        do {
          pjVar26->state = 3;
          iVar16 = iVar16 + -1;
          pjVar26 = pjVar26 + 1;
        } while (iVar16 != 0);
      }
      if (0 < dec->numtiles) {
        iVar16 = 0;
        do {
          iVar17 = iVar16 / dec->numhtiles;
          uVar21 = (long)iVar16 % (long)dec->numhtiles;
          pjVar23->realmode = 0;
          pjVar23->state = 0;
          uVar2 = dec->tilexoff;
          uVar3 = dec->tilewidth;
          uVar22 = uVar3 * (uVar21 & 0xffffffff) + uVar2;
          if (uVar22 <= dec->xstart) {
            uVar22 = dec->xstart;
          }
          pjVar23->xstart = uVar22;
          uVar4 = dec->tileyoff;
          uVar5 = dec->tileheight;
          uVar22 = uVar5 * (long)iVar17 + uVar4;
          if (uVar22 <= dec->ystart) {
            uVar22 = dec->ystart;
          }
          pjVar23->ystart = uVar22;
          uVar21 = ((int)uVar21 + 1) * uVar3 + uVar2;
          if (dec->xend <= uVar21) {
            uVar21 = dec->xend;
          }
          pjVar23->xend = uVar21;
          uVar21 = (long)(iVar17 + 1) * uVar5 + uVar4;
          if (dec->yend <= uVar21) {
            uVar21 = dec->yend;
          }
          pjVar23->yend = uVar21;
          pjVar23->partno = 0;
          pjVar23->numparts = 0;
          pjVar23->pi = (jpc_pi_t *)0x0;
          pjVar23->pptstab = (jpc_ppxstab_t *)0x0;
          pjVar23->pkthdrstream = (jas_stream_t *)0x0;
          pjVar23->pkthdrstreampos = 0;
          pjVar23->cp = (jpc_dec_cp_t *)0x0;
          pjVar24 = (jpc_dec_tcomp_t *)jas_alloc2((long)dec->numcomps,0x40);
          pjVar23->tcomps = pjVar24;
          if (pjVar24 == (jpc_dec_tcomp_t *)0x0) {
            return -1;
          }
          iVar17 = dec->numcomps;
          if (0 < iVar17) {
            pjVar20 = dec->cmpts;
            uVar2 = pjVar23->xstart;
            uVar3 = pjVar23->ystart;
            uVar4 = pjVar23->xend;
            uVar5 = pjVar23->yend;
            lVar30 = 0;
            do {
              *(undefined8 *)((long)&pjVar24->rlvls + lVar30) = 0;
              *(undefined4 *)((long)&pjVar24->numrlvls + lVar30) = 0;
              *(undefined8 *)((long)&pjVar24->data + lVar30) = 0;
              uVar21 = *(ulong *)((long)&pjVar20->hstep + lVar30);
              *(ulong *)((long)&pjVar24->xstart + lVar30) = ((uVar21 + uVar2) - 1) / uVar21;
              uVar22 = *(ulong *)((long)&pjVar20->vstep + lVar30);
              *(ulong *)((long)&pjVar24->ystart + lVar30) = ((uVar22 + uVar3) - 1) / uVar22;
              *(ulong *)((long)&pjVar24->xend + lVar30) = ((uVar21 + uVar4) - 1) / uVar21;
              *(ulong *)((long)&pjVar24->yend + lVar30) = ((uVar22 + uVar5) - 1) / uVar22;
              *(undefined8 *)((long)&pjVar24->tsfb + lVar30) = 0;
              lVar30 = lVar30 + 0x40;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          iVar16 = iVar16 + 1;
          pjVar23 = pjVar23 + 1;
        } while (iVar16 < dec->numtiles);
      }
      dec->pkthdrstreams = (jpc_streamlist_t *)0x0;
      dec->state = 4;
      return 0;
    }
    fmt = "tile too large\n";
  }
  else {
    fmt = "image too large\n";
  }
  jas_eprintf(fmt);
  return -1;
}

Assistant:

static int jpc_dec_process_siz(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_siz_t *siz = &ms->parms.siz;
	int compno;
	int tileno;
	jpc_dec_tile_t *tile;
	jpc_dec_tcomp_t *tcomp;
	int htileno;
	int vtileno;
	jpc_dec_cmpt_t *cmpt;
	size_t size;
	size_t num_samples;
	size_t num_samples_delta;

	size_t total_samples;
	if (!jas_safe_size_mul(siz->width, siz->height, &total_samples) ||
	    (dec->max_samples > 0 && total_samples > dec->max_samples)) {
		jas_eprintf("image too large\n");
		return -1;
	}

	size_t tile_samples;
	if (!jas_safe_size_mul(siz->tilewidth, siz->tileheight, &tile_samples) ||
	    (dec->max_samples > 0 && tile_samples > dec->max_samples)) {
		jas_eprintf("tile too large\n");
		return -1;
	}

	dec->xstart = siz->xoff;
	dec->ystart = siz->yoff;
	dec->xend = siz->width;
	dec->yend = siz->height;
	dec->tilewidth = siz->tilewidth;
	dec->tileheight = siz->tileheight;
	dec->tilexoff = siz->tilexoff;
	dec->tileyoff = siz->tileyoff;
	dec->numcomps = siz->numcomps;

	if (!(dec->cp = jpc_dec_cp_create(dec->numcomps))) {
		return -1;
	}

	if (!(dec->cmpts = jas_alloc2(dec->numcomps, sizeof(jpc_dec_cmpt_t)))) {
		return -1;
	}

	num_samples = 0;
	for (compno = 0, cmpt = dec->cmpts; compno < dec->numcomps; ++compno,
	  ++cmpt) {
		cmpt->prec = siz->comps[compno].prec;
		cmpt->sgnd = siz->comps[compno].sgnd;
		cmpt->hstep = siz->comps[compno].hsamp;
		cmpt->vstep = siz->comps[compno].vsamp;
		cmpt->width = JPC_CEILDIV(dec->xend, cmpt->hstep) -
		  JPC_CEILDIV(dec->xstart, cmpt->hstep);
		cmpt->height = JPC_CEILDIV(dec->yend, cmpt->vstep) -
		  JPC_CEILDIV(dec->ystart, cmpt->vstep);
		cmpt->hsubstep = 0;
		cmpt->vsubstep = 0;

		if (!jas_safe_size_mul(cmpt->width, cmpt->height, &num_samples_delta)) {
			jas_eprintf("image too large\n");
			return -1;
		}
		if (!jas_safe_size_add(num_samples, num_samples_delta, &num_samples)) {
			jas_eprintf("image too large\n");
			return -1;
		}
	}

	if (dec->max_samples > 0 && num_samples > dec->max_samples) {
		jas_eprintf("maximum number of samples exceeded (%zu > %zu)\n",
		  num_samples, dec->max_samples);
		return -1;
	}

	dec->image = 0;

	dec->numhtiles = JPC_CEILDIV(dec->xend - dec->tilexoff, dec->tilewidth);
	dec->numvtiles = JPC_CEILDIV(dec->yend - dec->tileyoff, dec->tileheight);
	assert(dec->numhtiles >= 0);
	assert(dec->numvtiles >= 0);
	if (!jas_safe_size_mul(dec->numhtiles, dec->numvtiles, &size) ||
	  size > INT_MAX) {
		return -1;
	}
	if (dec->max_samples > 0 && size > dec->max_samples / 16 / 16) {
		/* avoid Denial of Service by a malicious input file
		   with millions of tiny tiles; if max_samples is
		   configured, then assume the tiles are at least
		   16x16, and don't allow more than this number of
		   tiles */
		return -1;
	}
	if (dec->max_samples > 0 && size > dec->max_samples / dec->numcomps / 16) {
		/* another DoS check: since each tile allocates an
		   array of components, this check attempts to catch
		   excessive tile*component numbers */
		return -1;
	}
	dec->numtiles = size;
	JAS_DBGLOG(10, ("numtiles = %d; numhtiles = %d; numvtiles = %d;\n",
	  dec->numtiles, dec->numhtiles, dec->numvtiles));
	if (!(dec->tiles = jas_alloc2(dec->numtiles, sizeof(jpc_dec_tile_t)))) {
		return -1;
	}

	for (tileno = 0, tile = dec->tiles; tileno < dec->numtiles; ++tileno,
	  ++tile) {
		/* initialize all tiles with JPC_TILE_DONE so
		   jpc_dec_destroy() knows which ones need a
		   jpc_dec_tilefini() call; they are not actually
		   "done", of course */
		tile->state = JPC_TILE_DONE;
	}

	for (tileno = 0, tile = dec->tiles; tileno < dec->numtiles; ++tileno,
	  ++tile) {
		htileno = tileno % dec->numhtiles;
		vtileno = tileno / dec->numhtiles;
		tile->realmode = 0;
		tile->state = JPC_TILE_INIT;
		tile->xstart = JAS_MAX(dec->tilexoff + htileno * dec->tilewidth,
		  dec->xstart);
		tile->ystart = JAS_MAX(dec->tileyoff + vtileno * dec->tileheight,
		  dec->ystart);
		tile->xend = JAS_MIN(dec->tilexoff + (htileno + 1) *
		  dec->tilewidth, dec->xend);
		tile->yend = JAS_MIN(dec->tileyoff + (vtileno + 1) *
		  dec->tileheight, dec->yend);
		tile->numparts = 0;
		tile->partno = 0;
		tile->pkthdrstream = 0;
		tile->pkthdrstreampos = 0;
		tile->pptstab = 0;
		tile->cp = 0;
		tile->pi = 0;
		if (!(tile->tcomps = jas_alloc2(dec->numcomps,
		  sizeof(jpc_dec_tcomp_t)))) {
			return -1;
		}
		for (compno = 0, cmpt = dec->cmpts, tcomp = tile->tcomps;
		  compno < dec->numcomps; ++compno, ++cmpt, ++tcomp) {
			tcomp->rlvls = 0;
			tcomp->numrlvls = 0;
			tcomp->data = 0;
			tcomp->xstart = JPC_CEILDIV(tile->xstart, cmpt->hstep);
			tcomp->ystart = JPC_CEILDIV(tile->ystart, cmpt->vstep);
			tcomp->xend = JPC_CEILDIV(tile->xend, cmpt->hstep);
			tcomp->yend = JPC_CEILDIV(tile->yend, cmpt->vstep);
			tcomp->tsfb = 0;
		}
	}

	dec->pkthdrstreams = 0;

	/* We should expect to encounter other main header marker segments
	  or an SOT marker segment next. */
	dec->state = JPC_MH;

	return 0;
}